

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_highbd_quantize_avx2.c
# Opt level: O0

void av1_highbd_quantize_fp_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan,int log_scale)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  long in_RSI;
  long in_RDI;
  long in_stack_00000008;
  __m256i coeff;
  __m256i qp [3];
  uint step;
  __m256i *in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffda0 [32];
  int16_t *in_stack_fffffffffffffdc0;
  int16_t *in_stack_fffffffffffffdc8;
  int16_t *in_stack_fffffffffffffdd0;
  longlong local_220 [15];
  undefined4 local_1a4;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  undefined1 local_160 [32];
  tran_low_t *in_stack_ffffffffffffff48;
  tran_low_t *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff5c;
  int16_t *in_stack_ffffffffffffff60;
  __m256i *in_stack_ffffffffffffff68;
  __m256i *in_stack_ffffffffffffff70;
  
  local_1a4 = 8;
  local_180 = in_RSI;
  local_178 = in_RDI;
  init_qp(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
          in_stack_fffffffffffffda0._28_4_,in_stack_fffffffffffffda0._16_8_);
  local_168 = local_178;
  local_160._8_8_ = SUB328(ZEXT832(0),4);
  auVar2 = ZEXT832((ulong)local_160._8_8_);
  local_160 = ZEXT832(0) << 0x20;
  quantize(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
           in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
           in_stack_fffffffffffffd68);
  local_178 = local_178 + 0x20;
  in_stack_00000008 = in_stack_00000008 + 0x20;
  local_180 = local_180 + -8;
  update_qp((__m256i *)local_220);
  for (; 0 < local_180; local_180 = local_180 + -8) {
    local_170 = local_178;
    quantize(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             in_stack_fffffffffffffd68);
    local_178 = local_178 + 0x20;
    in_stack_00000008 = in_stack_00000008 + 0x20;
  }
  auVar3 = vpshufd_avx2(auVar2 << 0x40,0xe);
  auVar2 = vpmaxsw_avx2(auVar2 << 0x40,auVar3);
  auVar3 = vpshuflw_avx2(auVar2,0xe);
  auVar2 = vpmaxsw_avx2(auVar2,auVar3);
  auVar3 = vpshuflw_avx2(auVar2,1);
  auVar2 = vpmaxsw_avx2(auVar2,auVar3);
  auVar1 = vpmaxsw_avx(auVar2._0_16_,auVar2._16_16_);
  *dequant_ptr = auVar1._0_2_;
  return;
}

Assistant:

void av1_highbd_quantize_fp_avx2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan, int log_scale) {
  (void)scan;
  (void)zbin_ptr;
  (void)quant_shift_ptr;
  const unsigned int step = 8;
  __m256i qp[3], coeff;

  init_qp(round_ptr, quant_ptr, dequant_ptr, log_scale, qp);
  coeff = _mm256_loadu_si256((const __m256i *)coeff_ptr);

  __m256i eob = _mm256_setzero_si256();
  quantize(qp, &coeff, iscan, log_scale, qcoeff_ptr, dqcoeff_ptr, &eob);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan += step;
  n_coeffs -= step;

  update_qp(qp);
  while (n_coeffs > 0) {
    coeff = _mm256_loadu_si256((const __m256i *)coeff_ptr);
    quantize(qp, &coeff, iscan, log_scale, qcoeff_ptr, dqcoeff_ptr, &eob);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan += step;
    n_coeffs -= step;
  }
  {
    __m256i eob_s;
    eob_s = _mm256_shuffle_epi32(eob, 0xe);
    eob = _mm256_max_epi16(eob, eob_s);
    eob_s = _mm256_shufflelo_epi16(eob, 0xe);
    eob = _mm256_max_epi16(eob, eob_s);
    eob_s = _mm256_shufflelo_epi16(eob, 1);
    eob = _mm256_max_epi16(eob, eob_s);
    const __m128i final_eob = _mm_max_epi16(_mm256_castsi256_si128(eob),
                                            _mm256_extractf128_si256(eob, 1));
    *eob_ptr = _mm_extract_epi16(final_eob, 0);
  }
}